

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaSimClassRefineOne(Gia_Man_t *p,int i)

{
  int iVar1;
  int local_2c;
  int Ent;
  Gia_Obj_t *pObj;
  int i_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead( p, i )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                  ,0xc9,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
  }
  Vec_IntClear(p->vClassOld);
  Vec_IntClear(p->vClassNew);
  Vec_IntPush(p->vClassOld,i);
  Gia_ManObj(p,i);
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 != 0) {
    for (local_2c = Gia_ObjNext(p,i); local_2c != 0; local_2c = Gia_ObjNext(p,local_2c)) {
      iVar1 = Ssc_GiaSimAreEqual(p,i,local_2c);
      if (iVar1 == 0) {
        Vec_IntPush(p->vClassNew,local_2c);
      }
      else {
        Vec_IntPush(p->vClassOld,local_2c);
      }
    }
    iVar1 = Vec_IntSize(p->vClassNew);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      Ssc_GiaSimClassCreate(p,p->vClassOld);
      Ssc_GiaSimClassCreate(p,p->vClassNew);
      iVar1 = Vec_IntSize(p->vClassNew);
      if (iVar1 < 2) {
        p_local._4_4_ = 1;
      }
      else {
        iVar1 = Vec_IntEntry(p->vClassNew,0);
        iVar1 = Ssc_GiaSimClassRefineOne(p,iVar1);
        p_local._4_4_ = iVar1 + 1;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("Gia_ObjIsHead(p, i)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                ,0xce,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
}

Assistant:

int Ssc_GiaSimClassRefineOne( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqual( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Ssc_GiaSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}